

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O2

vector<field::GF2E,_std::allocator<field::GF2E>_> *
operator*(vector<field::GF2E,_std::allocator<field::GF2E>_> *__return_storage_ptr__,
         vector<field::GF2E,_std::allocator<field::GF2E>_> *lhs,
         vector<field::GF2E,_std::allocator<field::GF2E>_> *rhs)

{
  ulong *puVar1;
  pointer pGVar2;
  GF2E GVar3;
  ulong uVar4;
  size_t j;
  ulong uVar5;
  long lVar6;
  long lVar7;
  allocator_type local_41;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *local_40;
  ulong local_38;
  
  local_40 = lhs;
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::vector
            (__return_storage_ptr__,
             (((long)(lhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(lhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3) +
             ((long)(rhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(rhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3)) - 1,&local_41);
  lVar6 = 0;
  uVar4 = 0;
  while (uVar4 < (ulong)((long)(local_40->
                               super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_40->
                               super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3)) {
    lVar7 = 0;
    local_38 = uVar4;
    for (uVar5 = 0;
        pGVar2 = (rhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(rhs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)pGVar2 >> 3);
        uVar5 = uVar5 + 1) {
      GVar3 = field::GF2E::operator*
                        ((local_40->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                         _M_impl.super__Vector_impl_data._M_start + uVar4,
                         (GF2E *)((long)&pGVar2->data + lVar7));
      puVar1 = (ulong *)((long)&((__return_storage_ptr__->
                                 super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                                 _M_impl.super__Vector_impl_data._M_start)->data + lVar7 + lVar6);
      *puVar1 = *puVar1 ^ GVar3.data;
      lVar7 = lVar7 + 8;
    }
    lVar6 = lVar6 + 8;
    uVar4 = local_38 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<field::GF2E> operator*(const std::vector<field::GF2E> &lhs,
                                   const std::vector<field::GF2E> &rhs) {

  std::vector<field::GF2E> result(lhs.size() + rhs.size() - 1);
  for (size_t i = 0; i < lhs.size(); i++)
    for (size_t j = 0; j < rhs.size(); j++)
      result[i + j] += lhs[i] * rhs[j];

  return result;
}